

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<unsigned_short>(SpirVAssembly *this,deInt64 number)

{
  Buffer<unsigned_short> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<unsigned_short> local_33;
  value_type_conflict8 local_32;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  deInt64 local_18;
  deInt64 number_local;
  
  local_18 = number;
  number_local = (deInt64)this;
  this_00 = (Buffer<unsigned_short> *)operator_new(0x20);
  local_32 = (value_type_conflict8)local_18;
  std::allocator<unsigned_short>::allocator(&local_33);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_30,1,&local_32,&local_33);
  Buffer<unsigned_short>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_30);
  std::allocator<unsigned_short>::~allocator(&local_33);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}